

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mulldo(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 arg1;
  uint32_t uVar1;
  TCGv_i64 rl;
  TCGv_i64 rh;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  rl = tcg_temp_new_i64(tcg_ctx_00);
  rh = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rA(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  tcg_gen_muls2_i64_ppc64(tcg_ctx_00,rl,rh,arg1,cpu_gpr[uVar1]);
  uVar1 = rD(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],rl);
  tcg_gen_sari_i64_ppc64(tcg_ctx_00,rl,rl,0x3f);
  tcg_gen_setcond_i64_ppc64(tcg_ctx_00,TCG_COND_NE,cpu_ov,rl,rh);
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_ov32,cpu_ov);
  }
  tcg_gen_or_i64_ppc64(tcg_ctx_00,cpu_so,cpu_so,cpu_ov);
  tcg_temp_free_i64(tcg_ctx_00,rl);
  tcg_temp_free_i64(tcg_ctx_00,rh);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rD(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_mulldo(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_muls2_i64(tcg_ctx, t0, t1, cpu_gpr[rA(ctx->opcode)],
                      cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_mov_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);

    tcg_gen_sari_i64(tcg_ctx, t0, t0, 63);
    tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, cpu_ov, t0, t1);
    if (is_isa300(ctx)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}